

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::print_logo(Solver *this)

{
  ostream *poVar1;
  ostream *mod;
  Modifier reset;
  Modifier bold;
  Modifier def;
  Modifier green;
  string logo;
  Modifier *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  Modifier local_40 [5];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "----------------------------------------------------------------------------------------------\n           _\n          | |\n     __  _| |     ___  __ _ _ __ _ __\n     \\ \\/ / |    / _ \\/ _` | \'__| \'_ \\ \n      >  <| |___|  __/ (_| | |  | | | |\n     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n        xLearn   -- 0.44 Version --\n----------------------------------------------------------------------------------------------\n\n"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  Color::Modifier::Modifier(local_40,FG_GREEN);
  Color::Modifier::Modifier(&local_44,FG_DEFAULT);
  Color::Modifier::Modifier(&local_48,BOLD);
  Color::Modifier::Modifier(&local_4c,RESET);
  Color::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  poVar1 = Color::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  poVar1 = std::operator<<(poVar1,local_28);
  mod = Color::operator<<(poVar1,in_stack_ffffffffffffff88);
  Color::operator<<(poVar1,(Modifier *)mod);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Solver::print_logo() const {
  std::string logo = 
"----------------------------------------------------------------------------------------------\n"
                    "           _\n"
                    "          | |\n"
                    "     __  _| |     ___  __ _ _ __ _ __\n"
                    "     \\ \\/ / |    / _ \\/ _` | '__| '_ \\ \n"
                    "      >  <| |___|  __/ (_| | |  | | | |\n"
                    "     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n"
                    "        xLearn   -- 0.44 Version --\n"
"----------------------------------------------------------------------------------------------\n"
"\n";
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier def(Color::FG_DEFAULT);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << green << bold << logo << def << reset;
}